

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O1

RABlock * __thiscall
asmjit::ZoneStack<asmjit::RABlock_*>::popFirst(ZoneStack<asmjit::RABlock_*> *this)

{
  String *pSVar1;
  uint *puVar2;
  Block *pBVar3;
  String *pSVar4;
  bool bVar5;
  Error EVar6;
  RABlock *extraout_RAX;
  undefined4 extraout_var;
  RABlock *pRVar7;
  undefined4 extraout_var_00;
  uint uVar8;
  undefined8 *in_RCX;
  uint uVar9;
  undefined8 *extraout_RDX;
  uint *puVar10;
  char c;
  ZoneAllocator *in_RSI;
  uint *puVar11;
  String *this_00;
  undefined4 *in_R8;
  uint *puVar12;
  ulong size;
  
  if ((this->super_ZoneStackBase)._allocator == (ZoneAllocator *)0x0) {
    ZoneStack<asmjit::RABlock*>::popFirst();
  }
  else {
    pBVar3 = (this->super_ZoneStackBase)._block[0];
    in_RCX = (undefined8 *)pBVar3->_start;
    if (in_RCX != (undefined8 *)(this->super_ZoneStackBase)._block[1]->_end) {
      if (in_RCX != (undefined8 *)pBVar3->_end) {
        pRVar7 = (RABlock *)*in_RCX;
        pBVar3->_start = in_RCX + 1;
        if (in_RCX + 1 == (undefined8 *)pBVar3->_end) {
          ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
        }
        return pRVar7;
      }
      goto LAB_0012383b;
    }
  }
  ZoneStack<asmjit::RABlock*>::popFirst();
LAB_0012383b:
  ZoneStack<asmjit::RABlock*>::popFirst();
  if ((uint)in_RSI < ((ZoneVectorBase *)((long)this + 0x140))->_size) {
    return (RABlock *)
           ((Block *)((ZoneVectorBase *)((long)this + 0x140))->_data)->_link
           [(ulong)in_RSI & 0xffffffff];
  }
  BaseRAPass::workRegById();
  if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return (RABlock *)
           (((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator->_slots +
           (long)((long)&in_RSI[-1]._dynamicBlocks + 7));
  }
  ZoneVector<asmjit::RAWorkReg*>::operator[]();
  pRVar7 = (RABlock *)((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator;
  if (pRVar7 == (RABlock *)0x0) {
    return (RABlock *)0x0;
  }
  if (in_RSI->_zone == (Zone *)0x0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar9 = ((ZoneVectorBase *)this)->_capacity << 2;
    size = (ulong)uVar9;
    if (size != 0) {
      if (uVar9 < 0x201) {
        if (uVar9 < 0x81) {
          uVar8 = (uint)(size + 0x1fffffffff >> 5);
        }
        else {
          uVar8 = (int)(size + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar8 = 0;
      }
      if (uVar9 < 0x201) {
        pRVar7->_ra = (BaseRAPass *)in_RSI->_slots[uVar8];
        in_RSI->_slots[uVar8] = (Slot *)pRVar7;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar7,size);
        pRVar7 = extraout_RAX;
      }
      ((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator = (ZoneAllocator *)0x0;
      *(Block **)&((ZoneVectorBase *)this)->_size = (Block *)0x0;
      return pRVar7;
    }
  }
  ZoneVector<unsigned_int>::release();
  pRVar7 = (RABlock *)0x0;
  if (((ZoneVectorBase *)this)->_capacity <
      (uint)(*(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1))) {
    EVar6 = ZoneVectorBase::_reserve
                      ((ZoneVectorBase *)this,in_RSI,0xc,
                       *(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1));
    pRVar7 = (RABlock *)CONCAT44(extraout_var,EVar6);
  }
  if ((int)pRVar7 != 0) {
    return pRVar7;
  }
  pSVar4 = (String *)((ZoneVectorBase *)this)->_data;
  puVar12 = (uint *)*extraout_RDX;
  puVar10 = (uint *)*in_RCX;
  puVar2 = puVar12 + (ulong)*(uint *)(extraout_RDX + 1) * 3;
  puVar11 = puVar10 + (ulong)*(uint *)(in_RCX + 1) * 3;
  this_00 = pSVar4;
  if ((ulong)*(uint *)(in_RCX + 1) != 0 && (ulong)*(uint *)(extraout_RDX + 1) != 0) {
    uVar9 = *puVar12;
    do {
      while (uVar8 = puVar10[1], uVar8 <= uVar9) {
        *(uint *)&this_00->field_0 = *puVar10;
        *(uint *)((long)&this_00->field_0 + 4) = uVar8;
        *(undefined4 *)((long)&this_00->field_0 + 8) = *in_R8;
        this_00 = (String *)((long)&this_00->field_0 + 0xc);
        puVar10 = puVar10 + 3;
        if (puVar10 == puVar11) {
          bVar5 = true;
          goto LAB_001239f3;
        }
      }
      uVar9 = *puVar10;
      while (uVar8 = puVar12[1], uVar8 <= uVar9) {
        pSVar1 = (String *)((long)&this_00->field_0 + 0xc);
        *(uint *)&this_00->field_0 = *puVar12;
        *(uint *)((long)&this_00->field_0 + 4) = uVar8;
        *(uint *)((long)&this_00->field_0 + 8) = puVar12[2];
        puVar12 = puVar12 + 3;
        this_00 = pSVar1;
        if (puVar12 == puVar2) {
          bVar5 = true;
          goto LAB_001239f3;
        }
      }
      uVar9 = *puVar12;
    } while (puVar10[1] <= uVar9);
    pRVar7 = (RABlock *)0xffffffff;
    bVar5 = false;
LAB_001239f3:
    if (!bVar5) {
      return pRVar7;
    }
  }
  for (; puVar12 != puVar2; puVar12 = puVar12 + 3) {
    *(undefined8 *)&this_00->field_0 = *(undefined8 *)puVar12;
    *(uint *)((long)&this_00->field_0 + 8) = puVar12[2];
    this_00 = (String *)((long)&this_00->field_0 + 0xc);
  }
  for (; puVar10 != puVar11; puVar10 = puVar10 + 3) {
    *(undefined8 *)&this_00->field_0 = *(undefined8 *)puVar10;
    *(undefined4 *)((long)&this_00->field_0 + 8) = *in_R8;
    this_00 = (String *)((long)&this_00->field_0 + 0xc);
  }
  if ((this_00 < pSVar4) ||
     ((String *)((long)&pSVar4->field_0 + (ulong)((ZoneVectorBase *)this)->_capacity * 0xc) <
      this_00)) {
    RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  }
  else {
    this_00 = (String *)((ulong)((long)this_00 - (long)pSVar4) >> 2);
    uVar9 = (int)this_00 * -0x55555555;
    if (uVar9 <= ((ZoneVectorBase *)this)->_capacity) {
      ((ZoneVectorBase *)this)->_size = uVar9;
      return (RABlock *)0x0;
    }
  }
  c = (char)puVar11;
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  EVar6 = String::_opChar(this_00,1,c);
  return (RABlock *)CONCAT44(extraout_var_00,EVar6);
}

Assistant:

inline bool isInitialized() const noexcept { return _allocator != nullptr; }